

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::Read
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZStream *buf,void *context)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZStream *in_RDI;
  int is_1;
  int is;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  TPZGeoPyramid::Read((TPZGeoPyramid *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                      ,in_RDI,(void *)0x164c9fb);
  for (iVar1 = 0; iVar1 < 0xf; iVar1 = iVar1 + 1) {
    (*in_RDI[(long)iVar1 * 3 + 7]._vptr_TPZStream[6])(in_RDI + (long)iVar1 * 3 + 7,in_RSI,in_RDX);
  }
  for (iVar1 = 0; iVar1 < 0xf; iVar1 = iVar1 + 1) {
    (*in_RDI[(long)iVar1 * 0x34 + 0x34]._vptr_TPZStream[6])
              (in_RDI + (long)iVar1 * 0x34 + 0x34,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }